

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O2

void __thiscall
skiwi::environment<skiwi::environment_entry>::push_outer
          (environment<skiwi::environment_entry> *this,string *name,environment_entry e)

{
  mapped_type *pmVar1;
  __shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if ((this->p_outer).
      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
             ::operator[](&this->env,name);
    pmVar1->st = e.st;
    *(undefined4 *)&pmVar1->field_0x4 = e._4_4_;
    pmVar1->pos = e.pos;
    (pmVar1->live_range).first = e.live_range.first;
    (pmVar1->live_range).last = e.live_range.last;
  }
  else {
    std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_28,
                 &(this->p_outer).
                  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                );
    while (((local_28._M_ptr)->p_outer).
           super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != (element_type *)0x0) {
      std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&local_28,
                &((local_28._M_ptr)->p_outer).
                 super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
               );
    }
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
             ::operator[](&(local_28._M_ptr)->env,name);
    (pmVar1->live_range).first = e.live_range.first;
    (pmVar1->live_range).last = e.live_range.last;
    pmVar1->st = e.st;
    *(undefined4 *)&pmVar1->field_0x4 = e._4_4_;
    pmVar1->pos = e.pos;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  return;
}

Assistant:

void push_outer(const std::string& name, TEntry e)
      {
      /*
      if (p_outer)
        p_outer->push_outer(name, e);
      else
        env[name] = e;
      */
      if (p_outer)
        {
        auto p_outer_copy = p_outer;
        while (p_outer_copy->p_outer)
          p_outer_copy = p_outer_copy->p_outer;
        p_outer_copy->env[name] = e;
        }
      else
        env[name] = e;
      }